

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

ostream * pstack::Procman::operator<<(ostream *os,UnwindMechanism mech)

{
  ostream *poVar1;
  
  if (mech < (INVALID|DWARF)) {
    poVar1 = std::operator<<(os,&DAT_00142aa4 + *(int *)(&DAT_00142aa4 + (ulong)mech * 4));
    return poVar1;
  }
  abort();
}

Assistant:

std::ostream &operator << (std::ostream &os, UnwindMechanism mech) {
   switch (mech) {
      case UnwindMechanism::MACHINEREGS: return os << "machine registers";
      case UnwindMechanism::DWARF: return os << "DWARF";
      case UnwindMechanism::FRAMEPOINTER: return os << "frame pointer";
      case UnwindMechanism::BAD_IP_RECOVERY: return os << "popped faulting IP";
      case UnwindMechanism::TRAMPOLINE: return os << "signal trampoline";
      case UnwindMechanism::LOGFILE: return os << "log file";
      case UnwindMechanism::INVALID: return os << "invalid";
   }
   abort();
}